

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_unscaleSolutionReal
          (SoPlexBase<double> *this,SPxLPBase<double> *LP,bool persistent)

{
  bool bVar1;
  Verbosity VVar2;
  SPxOut *_spxout;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  Verbosity old_verbosity;
  char *in_stack_ffffffffffffffc8;
  char *manip;
  SPxOut *in_stack_ffffffffffffffd0;
  Verbosity local_1c;
  Verbosity local_18;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2)) {
    local_18 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
    local_1c = INFO1;
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_1c);
    _spxout = soplex::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if ((local_11 & 1) == 0) {
      manip = "internal";
    }
    else {
      manip = "external";
    }
    soplex::operator<<(_spxout,manip);
    soplex::operator<<(_spxout,manip);
    soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)manip);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_18);
  }
  (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x110))
            (*(long **)(in_RDI + 0x1cf0),local_10,in_RDI + 0x4e68);
  (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x118))
            (*(long **)(in_RDI + 0x1cf0),local_10,in_RDI + 0x4e80);
  (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x120))
            (*(long **)(in_RDI + 0x1cf0),local_10,in_RDI + 0x4eb0);
  (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x128))
            (*(long **)(in_RDI + 0x1cf0),local_10,in_RDI + 0x4ec8);
  bVar1 = SolBase<double>::hasPrimalRay((SolBase<double> *)(in_RDI + 0x4e68));
  if (bVar1) {
    (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x130))
              (*(long **)(in_RDI + 0x1cf0),local_10,in_RDI + 0x4e98);
  }
  bVar1 = SolBase<double>::hasDualFarkas((SolBase<double> *)(in_RDI + 0x4e68));
  if (bVar1) {
    (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x138))
              (*(long **)(in_RDI + 0x1cf0),local_10,in_RDI + 0x4ee0);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_unscaleSolutionReal(SPxLPBase<R>& LP, bool persistent)
{
   SPX_MSG_INFO1(spxout, spxout << " --- unscaling " << (persistent ? "external" : "internal") <<
                 " solution" << std::endl;)
   assert(_scaler);
   assert(!persistent || (boolParam(SoPlexBase<R>::PERSISTENTSCALING) && _isRealLPScaled));
   _scaler->unscalePrimal(LP, _solReal._primal);
   _scaler->unscaleSlacks(LP, _solReal._slacks);
   _scaler->unscaleDual(LP, _solReal._dual);
   _scaler->unscaleRedCost(LP, _solReal._redCost);

   if(_solReal.hasPrimalRay())
      _scaler->unscalePrimalray(LP, _solReal._primalRay);

   if(_solReal.hasDualFarkas())
      _scaler->unscaleDualray(LP, _solReal._dualFarkas);
}